

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_set.c
# Opt level: O3

int set_iterator_end(set_iterator *it)

{
  set_iterator __ptr;
  int iVar1;
  
  iVar1 = 0;
  if (((it != (set_iterator *)0x0) && (__ptr = *it, iVar1 = 0, __ptr != (set_iterator)0x0)) &&
     (iVar1 = 1, __ptr->s->capacity <= __ptr->current_bucket)) {
    free(__ptr);
    *it = (set_iterator)0x0;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int set_iterator_end(set_iterator *it)
{
	if (it != NULL && *it != NULL)
	{
		if ((*it)->current_bucket >= (*it)->s->capacity)
		{
			free(*it);

			*it = NULL;

			return 0;
		}

		return 1;
	}

	return 0;
}